

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O2

void ssh2_bpp_handle_output(BinaryPacketProtocol *bpp)

{
  PktOutQueue *pPVar1;
  int *s;
  int iVar2;
  PktOut *pPVar3;
  size_t sVar4;
  PacketQueueNode *pPVar5;
  int iVar6;
  
  pPVar1 = &bpp->out_pq;
  iVar6 = 0;
  pPVar5 = (PacketQueueNode *)pPVar1;
  while( true ) {
    pPVar3 = (*(bpp->out_pq).after)(&pPVar1->pqb,pPVar5,false);
    if (pPVar3 == (PktOut *)0x0) break;
    iVar6 = iVar6 + (uint)(pPVar3->type - 0x32U < 0x14);
    pPVar5 = &pPVar3->qnode;
  }
  if ((bpp[-1].ic_out_pq.field_0x12 != '\x01') || (iVar6 != 0)) {
    s = &bpp[-2].remote_bugs;
    if ((char)bpp[-1].out_pq.pqb.end.formal_size == '\x01') {
      sVar4 = bufchain_size(bpp->out_raw);
      if (sVar4 < (ulong)((long)*(int *)(*(long *)bpp[-1].ic_in_raw.fn + 0x40) +
                         (long)*(int *)(*(long *)bpp[-1].ssh + 0x48))) {
        pPVar3 = (*bpp->vt->new_pktout)(2);
        BinarySink_put_stringz(pPVar3->binarysink_,"");
        ssh2_bpp_format_packet((ssh2_bpp_state *)s,pPVar3);
      }
    }
    while( true ) {
      pPVar3 = (*(bpp->out_pq).after)(&pPVar1->pqb,(PacketQueueNode *)pPVar1,true);
      if (pPVar3 == (PktOut *)0x0) {
        ssh_sendbuffer_changed(bpp->ssh);
        return;
      }
      iVar2 = pPVar3->type;
      ssh2_bpp_format_packet((ssh2_bpp_state *)s,pPVar3);
      ssh_free_pktout(pPVar3);
      iVar6 = iVar6 - (uint)(iVar2 - 0x32U < 0x14);
      if (((iVar6 == 0) && (*(long *)&bpp[-1].ic_in_raw.queued != 0)) &&
         (bpp[-1].ic_out_pq.queued == false)) break;
      if ((iVar2 == 0x34) && (bpp[-1].ic_out_pq.queued == true)) {
        ssh2_bpp_enable_pending_compression((ssh2_bpp_state *)s);
      }
    }
    bpp[-1].ic_out_pq.field_0x12 = 1;
  }
  return;
}

Assistant:

static void ssh2_bpp_handle_output(BinaryPacketProtocol *bpp)
{
    struct ssh2_bpp_state *s = container_of(bpp, struct ssh2_bpp_state, bpp);
    PktOut *pkt;
    int n_userauth;

    /*
     * Count the userauth packets in the queue.
     */
    n_userauth = 0;
    for (pkt = pq_first(&s->bpp.out_pq); pkt != NULL;
         pkt = pq_next(&s->bpp.out_pq, pkt))
        if (userauth_range(pkt->type))
            n_userauth++;

    if (s->pending_compression && !n_userauth) {
        /*
         * We're currently blocked from sending any outgoing packets
         * until the other end tells us whether we're going to have to
         * enable compression or not.
         *
         * If our end has pushed a userauth packet on the queue, that
         * must mean it knows that a USERAUTH_SUCCESS is not
         * immediately forthcoming, so we unblock ourselves and send
         * up to and including that packet. But in this if statement,
         * there aren't any, so we're still blocked.
         */
        return;
    }

    if (s->cbc_ignore_workaround) {
        /*
         * When using a CBC-mode cipher in SSH-2, it's necessary to
         * ensure that an attacker can't provide data to be encrypted
         * using an IV that they know. We ensure this by inserting an
         * SSH_MSG_IGNORE if the last cipher block of the previous
         * packet has already been sent to the network (which we
         * approximate conservatively by checking if it's vanished
         * from out_raw).
         */
        if (bufchain_size(s->bpp.out_raw) <
            (ssh_cipher_alg(s->out.cipher)->blksize +
             ssh2_mac_alg(s->out.mac)->len)) {
            /*
             * There's less data in out_raw than the MAC size plus the
             * cipher block size, which means at least one byte of
             * that cipher block must already have left. Add an
             * IGNORE.
             */
            pkt = ssh_bpp_new_pktout(&s->bpp, SSH2_MSG_IGNORE);
            put_stringz(pkt, "");
            ssh2_bpp_format_packet(s, pkt);
        }
    }

    while ((pkt = pq_pop(&s->bpp.out_pq)) != NULL) {
        int type = pkt->type;

        if (userauth_range(type))
            n_userauth--;

        ssh2_bpp_format_packet(s, pkt);
        ssh_free_pktout(pkt);

        if (n_userauth == 0 && s->out.pending_compression && !s->is_server) {
            /*
             * This is the last userauth packet in the queue, so
             * unless our side decides to send another one in future,
             * we have to assume will potentially provoke
             * USERAUTH_SUCCESS. Block (non-userauth) outgoing packets
             * until we see the reply.
             */
            s->pending_compression = true;
            return;
        } else if (type == SSH2_MSG_USERAUTH_SUCCESS && s->is_server) {
            ssh2_bpp_enable_pending_compression(s);
        }
    }

    ssh_sendbuffer_changed(bpp->ssh);
}